

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ROMInfo.cpp
# Opt level: O2

ROMInfo * MT32Emu::ROMInfo::getROMInfo(File *file)

{
  ROMInfo *pRVar1;
  
  getROMInfoLists();
  pRVar1 = getROMInfo(file,getROMInfoLists::ALL_ROM_INFOS);
  return pRVar1;
}

Assistant:

const ROMInfo *ROMInfo::getROMInfo(File *file) {
	return getROMInfo(file, getKnownROMInfoList());
}